

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::setRowHidden(QTreeView *this,int row,QModelIndex *parent,bool hide)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  QPersistentModelIndex *this_01;
  long in_FS_OFFSET;
  QPersistentModelIndex local_60 [2];
  QPersistentModelIndex local_50;
  QModelIndex local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = this_00->model;
  if (pQVar1 == (QAbstractItemModel *)0x0) goto LAB_0053ec5c;
  local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.r = -0x55555556;
  local_48.c = -0x55555556;
  local_48.i._0_4_ = 0xaaaaaaaa;
  local_48.i._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_48,pQVar1,row,0,parent);
  if (((local_48.r < 0) || (local_48.c < 0)) || (local_48.m.ptr == (QAbstractItemModel *)0x0))
  goto LAB_0053ec5c;
  if (hide) {
    this_01 = &local_50;
    QPersistentModelIndex::QPersistentModelIndex(this_01,&local_48);
    QSet<QPersistentModelIndex>::insert
              ((QSet<QPersistentModelIndex> *)local_60,
               (QPersistentModelIndex *)
               &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                .redirectDev);
LAB_0053ec4a:
    QPersistentModelIndex::~QPersistentModelIndex(this_01);
  }
  else {
    bVar2 = QAbstractItemViewPrivate::isPersistent(this_00,&local_48);
    if (bVar2) {
      this_01 = local_60;
      QPersistentModelIndex::QPersistentModelIndex(this_01,&local_48);
      QHash<QPersistentModelIndex,_QHashDummyValue>::removeImpl<QPersistentModelIndex>
                ((QHash<QPersistentModelIndex,_QHashDummyValue> *)
                 &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                  super_QWidgetPrivate.redirectDev,this_01);
      goto LAB_0053ec4a;
    }
  }
  QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,0);
LAB_0053ec5c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::setRowHidden(int row, const QModelIndex &parent, bool hide)
{
    Q_D(QTreeView);
    if (!d->model)
        return;
    QModelIndex index = d->model->index(row, 0, parent);
    if (!index.isValid())
        return;

    if (hide) {
        d->hiddenIndexes.insert(index);
    } else if (d->isPersistent(index)) { //if the index is not persistent, it cannot be in the set
        d->hiddenIndexes.remove(index);
    }

    d->doDelayedItemsLayout();
}